

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

int N_VLinearCombination_Serial(int nvec,realtype *c,N_Vector *X,N_Vector z)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  if (nvec < 1) {
    return -1;
  }
  if (nvec == 2) {
    N_VLinearSum_Serial(*c,*X,c[1],X[1],z);
  }
  else if (nvec == 1) {
    N_VScale_Serial(*c,*X,z);
  }
  else {
    lVar1 = *z->content;
    lVar2 = *(long *)((long)z->content + 0x10);
    if (*X == z) {
      if ((*c != 1.0) || (NAN(*c))) {
        if (0 < lVar1) {
          lVar4 = 0;
          do {
            *(double *)(lVar2 + lVar4 * 8) = *c * *(double *)(lVar2 + lVar4 * 8);
            lVar4 = lVar4 + 1;
          } while (lVar1 != lVar4);
          if (nvec == 1) {
            return 0;
          }
        }
        uVar3 = 2;
        if (2 < nvec) {
          uVar3 = (ulong)(uint)nvec;
        }
        uVar6 = 1;
        do {
          if (0 < lVar1) {
            lVar4 = *(long *)((long)X[uVar6]->content + 0x10);
            lVar5 = 0;
            do {
              *(double *)(lVar2 + lVar5 * 8) =
                   c[uVar6] * *(double *)(lVar4 + lVar5 * 8) + *(double *)(lVar2 + lVar5 * 8);
              lVar5 = lVar5 + 1;
            } while (lVar1 != lVar5);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar3);
      }
      else {
        uVar3 = 1;
        do {
          if (0 < lVar1) {
            lVar4 = *(long *)((long)X[uVar3]->content + 0x10);
            lVar5 = 0;
            do {
              *(double *)(lVar2 + lVar5 * 8) =
                   c[uVar3] * *(double *)(lVar4 + lVar5 * 8) + *(double *)(lVar2 + lVar5 * 8);
              lVar5 = lVar5 + 1;
            } while (lVar1 != lVar5);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != (uint)nvec);
      }
    }
    else {
      if (0 < lVar1) {
        lVar4 = *(long *)((long)(*X)->content + 0x10);
        lVar5 = 0;
        do {
          *(double *)(lVar2 + lVar5 * 8) = *c * *(double *)(lVar4 + lVar5 * 8);
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
        if (nvec == 1) {
          return 0;
        }
      }
      uVar3 = 2;
      if (2 < nvec) {
        uVar3 = (ulong)(uint)nvec;
      }
      uVar6 = 1;
      do {
        if (0 < lVar1) {
          lVar4 = *(long *)((long)X[uVar6]->content + 0x10);
          lVar5 = 0;
          do {
            *(double *)(lVar2 + lVar5 * 8) =
                 c[uVar6] * *(double *)(lVar4 + lVar5 * 8) + *(double *)(lVar2 + lVar5 * 8);
            lVar5 = lVar5 + 1;
          } while (lVar1 != lVar5);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar3);
    }
  }
  return 0;
}

Assistant:

int N_VLinearCombination_Serial(int nvec, realtype* c, N_Vector* X, N_Vector z)
{
  int          i;
  sunindextype j, N;
  realtype*    zd=NULL;
  realtype*    xd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VScale */
  if (nvec == 1) {
    N_VScale_Serial(c[0], X[0], z);
    return(0);
  }

  /* should have called N_VLinearSum */
  if (nvec == 2) {
    N_VLinearSum_Serial(c[0], X[0], c[1], X[1], z);
    return(0);
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(z);
  zd = NV_DATA_S(z);

  /*
   * X[0] += c[i]*X[i], i = 1,...,nvec-1
   */
  if ((X[0] == z) && (c[0] == ONE)) {
    for (i=1; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        zd[j] += c[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * X[0] = c[0] * X[0] + sum{ c[i] * X[i] }, i = 1,...,nvec-1
   */
  if (X[0] == z) {
    for (j=0; j<N; j++) {
      zd[j] *= c[0];
    }
    for (i=1; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        zd[j] += c[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * z = sum{ c[i] * X[i] }, i = 0,...,nvec-1
   */
  xd = NV_DATA_S(X[0]);
  for (j=0; j<N; j++) {
    zd[j] = c[0] * xd[j];
  }
  for (i=1; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    for (j=0; j<N; j++) {
      zd[j] += c[i] * xd[j];
    }
  }
  return(0);
}